

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.cpp
# Opt level: O1

bool __thiscall
UnifiedRegex::Matcher::MatchSingleCharCaseInsensitive
          (Matcher *this,Char *input,CharCount inputLength,CharCount offset,Char c)

{
  uint64 *puVar1;
  Type TVar2;
  Type TVar3;
  code *pcVar4;
  MappingSource mappingSource;
  bool bVar5;
  undefined4 *puVar6;
  GroupInfo *pGVar7;
  Type TVar8;
  
  TVar2 = ((this->program).ptr)->flags;
  mappingSource = TVar2 >> 3 & CaseFolding;
  if ((TVar2 & StickyRegexFlag) == NoRegexFlags) {
    if (offset < inputLength) {
      do {
        if (this->stats != (Type)0x0) {
          puVar1 = &this->stats->numCompares;
          *puVar1 = *puVar1 + 1;
        }
        bVar5 = MatchSingleCharCaseInsensitiveHere(this,mappingSource,input,offset,c);
        if (bVar5) {
          if (((this->program).ptr)->numGroups == 0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
            *puVar6 = 1;
            bVar5 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.h"
                               ,0x782,"(groupId >= 0 && groupId < program->numGroups)",
                               "groupId >= 0 && groupId < program->numGroups");
            if (!bVar5) goto LAB_00f00201;
            *puVar6 = 0;
          }
          pGVar7 = (this->groupInfos).ptr;
          goto LAB_00f001e5;
        }
        offset = offset + 1;
      } while (inputLength != offset);
    }
    if (((this->program).ptr)->numGroups == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.h"
                         ,0x782,"(groupId >= 0 && groupId < program->numGroups)",
                         "groupId >= 0 && groupId < program->numGroups");
      if (!bVar5) goto LAB_00f00201;
      *puVar6 = 0;
    }
    pGVar7 = (this->groupInfos).ptr;
  }
  else {
    if (this->stats != (Type)0x0) {
      puVar1 = &this->stats->numCompares;
      *puVar1 = *puVar1 + 1;
    }
    bVar5 = MatchSingleCharCaseInsensitiveHere(this,mappingSource,input,offset,c);
    TVar3 = ((this->program).ptr)->numGroups;
    if (bVar5) {
      if (TVar3 == 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar6 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.h"
                           ,0x782,"(groupId >= 0 && groupId < program->numGroups)",
                           "groupId >= 0 && groupId < program->numGroups");
        if (!bVar5) goto LAB_00f00201;
        *puVar6 = 0;
      }
      pGVar7 = (this->groupInfos).ptr;
LAB_00f001e5:
      pGVar7->offset = offset;
      bVar5 = true;
      TVar8 = 1;
      goto LAB_00f001ef;
    }
    if (TVar3 == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.h"
                         ,0x782,"(groupId >= 0 && groupId < program->numGroups)",
                         "groupId >= 0 && groupId < program->numGroups");
      if (!bVar5) {
LAB_00f00201:
        pcVar4 = (code *)invalidInstructionException();
        (*pcVar4)();
      }
      *puVar6 = 0;
    }
    pGVar7 = (this->groupInfos).ptr;
  }
  TVar8 = 0xffffffff;
  bVar5 = false;
LAB_00f001ef:
  pGVar7->length = TVar8;
  return bVar5;
}

Assistant:

inline bool Matcher::MatchSingleCharCaseInsensitive(const Char* const input, const CharCount inputLength, CharCount offset, const Char c)
    {
        CaseInsensitive::MappingSource mappingSource = program->GetCaseMappingSource();

        // If sticky flag is present, break since the 1st character didn't match the pattern character
        if ((program->flags & StickyRegexFlag) != 0)
        {
#if ENABLE_REGEX_CONFIG_OPTIONS
            CompStats();
#endif
            if (MatchSingleCharCaseInsensitiveHere(mappingSource, input, offset, c))
            {
                GroupInfo* const info = GroupIdToGroupInfo(0);
                info->offset = offset;
                info->length = 1;
                return true;
            }
            else
            {
                ResetGroup(0);
                return false;
            }
        }

        while (offset < inputLength)
        {
#if ENABLE_REGEX_CONFIG_OPTIONS
            CompStats();
#endif
            if (MatchSingleCharCaseInsensitiveHere(mappingSource, input, offset, c))
            {
                GroupInfo* const info = GroupIdToGroupInfo(0);
                info->offset = offset;
                info->length = 1;
                return true;
            }
            offset++;
        }

        ResetGroup(0);
        return false;
    }